

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerProfiledNewArray(Lowerer *this,JitProfilingInstr *instr,bool hasArgs)

{
  OpCode OVar1;
  Func *func;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  int32 iVar5;
  Instr *pIVar6;
  undefined4 *puVar7;
  AddrOpnd *dst;
  IntConstOpnd *pIVar8;
  RegOpnd *opndArg;
  Opnd *opndArg_00;
  HelperCallOpnd *this_00;
  Lowerer *this_01;
  
  pIVar6 = InsertLoweredRegionStartMarker(this,&instr->super_Instr);
  if ((instr->field_0x60 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1155,"(instr->isNewArray)","instr->isNewArray");
    if (!bVar3) goto LAB_005cbeb3;
    *puVar7 = 0;
  }
  if (instr->arrayProfileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1156,"(instr->arrayProfileId != Js::Constants::NoProfileId)",
                       "instr->arrayProfileId != Js::Constants::NoProfileId");
    if (!bVar3) goto LAB_005cbeb3;
    *puVar7 = 0;
  }
  if (instr->profileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1157,"(instr->profileId != Js::Constants::NoProfileId)",
                       "instr->profileId != Js::Constants::NoProfileId");
    if (!bVar3) goto LAB_005cbeb3;
    *puVar7 = 0;
  }
  OVar1 = (instr->super_Instr).m_opcode;
  this_01 = (Lowerer *)&this->m_lowererMD;
  dst = IR::AddrOpnd::New((Var)0x0,AddrOpndKindConstantVar,this->m_func,true,(Var)0x0);
  LowererMD::LoadNewScObjFirstArg
            ((LowererMD *)this_01,&instr->super_Instr,&dst->super_Opnd,
             (ushort)(OVar1 == NewScObjectSpread || OVar1 == NewScObjArraySpread));
  if ((OVar1 == NewScObjectSpread) || (OVar1 == NewScObjArraySpread)) {
    LowerSpreadCall(this,&instr->super_Instr,CallFlags_New,true);
    this_01 = this;
  }
  else {
    iVar5 = LowererMDArch::LowerCallArgs
                      (&(this->m_lowererMD).lowererMDArch,&instr->super_Instr,1,4,
                       (IntConstOpnd **)0x0);
    pIVar8 = IR::Opnd::CreateProfileIdOpnd(instr->arrayProfileId,this->m_func);
    LowererMD::LoadHelperArgument((LowererMD *)this_01,&instr->super_Instr,&pIVar8->super_Opnd);
    pIVar8 = IR::Opnd::CreateProfileIdOpnd(instr->profileId,this->m_func);
    LowererMD::LoadHelperArgument((LowererMD *)this_01,&instr->super_Instr,&pIVar8->super_Opnd);
    opndArg = IR::Opnd::CreateFramePointerOpnd(this->m_func);
    LowererMD::LoadHelperArgument((LowererMD *)this_01,&instr->super_Instr,&opndArg->super_Opnd);
    opndArg_00 = IR::Instr::UnlinkSrc1(&instr->super_Instr);
    LowererMD::LoadHelperArgument((LowererMD *)this_01,&instr->super_Instr,opndArg_00);
    this_00 = IR::HelperCallOpnd::New(HelperProfiledNewScObjArray,this->m_func);
    if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar3) goto LAB_005cbeb3;
      *puVar7 = 0;
    }
    func = (instr->super_Instr).m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar3) {
LAB_005cbeb3:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    bVar4 = (this_00->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      this_00 = (HelperCallOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,func);
      bVar4 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar4 | 2;
    (instr->super_Instr).m_src1 = &this_00->super_Opnd;
    LowererMD::LowerCall((LowererMD *)this_01,&instr->super_Instr,(ArgSlot)iVar5);
  }
  pIVar6 = RemoveLoweredRegionStartMarker(this_01,pIVar6);
  return pIVar6;
}

Assistant:

IR::Instr* Lowerer::LowerProfiledNewArray(IR::JitProfilingInstr* instr, bool hasArgs)
{
    // Use the special helper which checks whether Array has been overwritten by the user and if
    //   it hasn't, possibly allocates a native array

    // Insert a temporary label before the instruction we're about to lower, so that we can return
    // the first instruction above that needs to be lowered after we're done - regardless of argument
    // list, StartCall, etc.
    IR::Instr* startMarkerInstr = InsertLoweredRegionStartMarker(instr);

    Assert(instr->isNewArray);
    Assert(instr->arrayProfileId != Js::Constants::NoProfileId);
    Assert(instr->profileId != Js::Constants::NoProfileId);

    bool isSpreadCall = instr->m_opcode == Js::OpCode::NewScObjectSpread || instr->m_opcode == Js::OpCode::NewScObjArraySpread;

    m_lowererMD.LoadNewScObjFirstArg(instr, IR::AddrOpnd::New(nullptr, IR::AddrOpndKindConstantVar, m_func, true), isSpreadCall ? 1 : 0);

    if (isSpreadCall)
    {
        this->LowerSpreadCall(instr, Js::CallFlags_New, true);
    }
    else
    {
        const int32 argCount = m_lowererMD.LowerCallArgs(instr, Js::CallFlags_New, 4);

        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->arrayProfileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateProfileIdOpnd(instr->profileId, m_func));
        m_lowererMD.LoadHelperArgument(instr, IR::Opnd::CreateFramePointerOpnd(m_func));
        m_lowererMD.LoadHelperArgument(instr, instr->UnlinkSrc1());

        instr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperProfiledNewScObjArray, m_func));
        m_lowererMD.LowerCall(instr, static_cast<Js::ArgSlot>(argCount));
    }

    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}